

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoDGofR.cpp
# Opt level: O1

void __thiscall
OpenMD::TwoDGofR::TwoDGofR
          (TwoDGofR *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          RealType dz,int nrbins)

{
  long *plVar1;
  long *plVar2;
  ulong __new_size;
  long *local_68;
  long local_58;
  long lStack_50;
  string local_48;
  
  RadialDistrFunc::RadialDistrFunc(&this->super_RadialDistrFunc,info,filename,sele1,sele2,nrbins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__TwoDGofR_0033b980;
  this->len_ = len;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  this->deltaR_ = len / (double)__new_size;
  this->deltaZ_ = dz;
  std::vector<int,_std::allocator<int>_>::resize(&this->histogram_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->avgTwoDGofR_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  getPrefix(&local_48,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
    local_68 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TwoDGofR::TwoDGofR(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2,
                     RealType len, RealType dz, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len) {
    deltaR_ = len_ / nBins_;

    deltaZ_ = dz;

    histogram_.resize(nBins_);
    avgTwoDGofR_.resize(nBins_);

    setOutputName(getPrefix(filename) + ".TwoDGofR");
  }